

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

float * GetStyleVarFloatAddr(ImGuiStyleVar idx)

{
  ImGuiStyle *pIVar1;
  
  pIVar1 = (ImGuiStyle *)0x0;
  switch(idx) {
  case 0:
    pIVar1 = &GImGui->Style;
    break;
  case 2:
    pIVar1 = (ImGuiStyle *)&(GImGui->Style).WindowRounding;
    break;
  case 4:
    pIVar1 = (ImGuiStyle *)&(GImGui->Style).ChildWindowRounding;
    break;
  case 6:
    pIVar1 = (ImGuiStyle *)&(GImGui->Style).FrameRounding;
    break;
  case 9:
    pIVar1 = (ImGuiStyle *)&(GImGui->Style).IndentSpacing;
    break;
  case 10:
    pIVar1 = (ImGuiStyle *)&(GImGui->Style).GrabMinSize;
  }
  return &pIVar1->Alpha;
}

Assistant:

static float* GetStyleVarFloatAddr(ImGuiStyleVar idx)
{
    ImGuiContext& g = *GImGui;
    switch (idx)
    {
    case ImGuiStyleVar_Alpha: return &g.Style.Alpha;
    case ImGuiStyleVar_WindowRounding: return &g.Style.WindowRounding;
    case ImGuiStyleVar_ChildWindowRounding: return &g.Style.ChildWindowRounding;
    case ImGuiStyleVar_FrameRounding: return &g.Style.FrameRounding;
    case ImGuiStyleVar_IndentSpacing: return &g.Style.IndentSpacing;
    case ImGuiStyleVar_GrabMinSize: return &g.Style.GrabMinSize;
    }
    return NULL;
}